

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxml2cpp.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_150;
  undefined8 local_138;
  undefined8 uStack_130;
  int local_11c;
  undefined1 local_118 [208];
  Data *local_48;
  undefined1 uStack_40;
  undefined7 uStack_3f;
  undefined1 uStack_38;
  undefined8 uStack_37;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_138 = 0xaaaaaaaaaaaaaaaa;
  uStack_130 = 0xaaaaaaaaaaaaaaaa;
  local_11c = argc;
  QCoreApplication::QCoreApplication((QCoreApplication *)&local_138,&local_11c,argv,0x60a00);
  local_118._0_8_ = (Data *)0x0;
  local_150.d = (Data *)0x0;
  local_150.ptr = (char16_t *)0x0;
  local_118._8_8_ = L"qdbusxml2cpp";
  local_150.size = 0;
  local_118._16_8_ = 0xc;
  QCoreApplication::setApplicationName((QString *)local_118);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_118);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_150);
  local_118._0_8_ = (Data *)0x0;
  local_150.d = (Data *)0x0;
  local_150.ptr = (char16_t *)0x0;
  local_118._8_8_ = L"0.8";
  local_150.size = 0;
  local_118._16_8_ = 3;
  QCoreApplication::setApplicationVersion((QString *)local_118);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_118);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_150);
  memset((QDBusXmlToCpp *)local_118,0,0xf0);
  local_118._200_8_ = &PTR__DiagnosticsReporter_00112980;
  local_48 = (Data *)0x0;
  uStack_40 = 0;
  uStack_3f = 0;
  uStack_38 = 0;
  uStack_37 = 0;
  iVar1 = QDBusXmlToCpp::run((QDBusXmlToCpp *)local_118,(QCoreApplication *)&local_138);
  QDBusXmlToCpp::~QDBusXmlToCpp((QDBusXmlToCpp *)local_118);
  QCoreApplication::~QCoreApplication((QCoreApplication *)&local_138);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int main(int argc, char **argv)
{
    QCoreApplication app(argc, argv);
    QCoreApplication::setApplicationName(QStringLiteral(PROGRAMNAME));
    QCoreApplication::setApplicationVersion(QStringLiteral(PROGRAMVERSION));

    return QDBusXmlToCpp().run(app);
}